

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O3

int32_t utrie2_internalU8PrevIndex_63(UTrie2 *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint16_t *puVar4;
  int iVar5;
  uint uVar6;
  uint8_t *s;
  int local_1c;
  
  iVar5 = 7;
  s = src + -7;
  if ((long)src - (long)start < 8) {
    iVar5 = (int)((long)src - (long)start);
    s = start;
  }
  local_1c = iVar5;
  uVar2 = utf8_prevCharSafeBody_63(s,0,&local_1c,c,-1);
  if (uVar2 < 0xd800) {
    puVar4 = trie->index;
    uVar6 = uVar2 >> 5;
LAB_00307194:
    uVar1 = puVar4[uVar6];
  }
  else {
    if (uVar2 < 0x10000) {
      uVar6 = (uVar2 >> 5) + 0x140;
      if (0xdbff < uVar2) {
        uVar6 = uVar2 >> 5;
      }
      puVar4 = trie->index;
      goto LAB_00307194;
    }
    if (0x10ffff < uVar2) {
      iVar3 = 0x80;
      if (trie->data32 == (uint32_t *)0x0) {
        iVar3 = trie->indexLength + 0x80;
      }
      goto LAB_0030719e;
    }
    if (trie->highStart <= (int)uVar2) {
      iVar3 = trie->highValueIndex;
      goto LAB_0030719e;
    }
    uVar1 = trie->index[(uVar2 >> 5 & 0x3f) + (uint)trie->index[(ulong)(uVar2 >> 0xb) + 0x820]];
  }
  iVar3 = (uVar2 & 0x1f) + (uint)uVar1 * 4;
LAB_0030719e:
  return iVar3 << 3 | iVar5 - local_1c;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8PrevIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((src-start)<=7) {
        i=length=(int32_t)(src-start);
    } else {
        i=length=7;
        start=src-7;
    }
    c=utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i=length-i;  /* number of bytes read backward from src */
    return u8Index(trie, c, i);
}